

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * google::protobuf::internal::HandleMessage
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  EnumDescriptor *this;
  Message *field_00;
  FieldDescriptor *this_00;
  char *message;
  bool bVar1;
  WireType WVar2;
  int iVar3;
  Data *pDVar4;
  LogMessage *pLVar5;
  Descriptor *this_01;
  Reflection *this_02;
  EnumValueDescriptor *pEVar6;
  UnknownFieldSet *this_03;
  string local_a8;
  EnumDescriptor *local_88;
  EnumDescriptor *enum_type;
  FieldDescriptor *value_field;
  byte local_61;
  LogMessage local_60;
  Voidify local_49;
  MessageLite *local_48;
  Message *sub_message;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  uint64_t tag_local;
  ParseContext *ctx_local;
  char *ptr_local;
  Message *msg_local;
  
  sub_message = (Message *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)tag;
  tag_local = (uint64_t)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  bVar1 = FieldDescriptor::is_repeated(field);
  message = ptr_local;
  this_00 = field_local;
  field_00 = sub_message;
  if (bVar1) {
    pDVar4 = ParseContext::data((ParseContext *)tag_local);
    local_48 = &Reflection::AddMessage
                          ((Reflection *)this_00,(Message *)message,(FieldDescriptor *)field_00,
                           pDVar4->factory)->super_MessageLite;
  }
  else {
    pDVar4 = ParseContext::data((ParseContext *)tag_local);
    local_48 = &Reflection::MutableMessage
                          ((Reflection *)this_00,(Message *)message,(FieldDescriptor *)field_00,
                           pDVar4->factory)->super_MessageLite;
  }
  WVar2 = WireFormatLite::GetTagWireType((uint32_t)reflection_local);
  if (WVar2 == WIRETYPE_START_GROUP) {
    msg_local = (Message *)
                ParseContext::ParseGroup
                          ((ParseContext *)tag_local,local_48,(char *)ctx_local,
                           (uint32_t)reflection_local);
  }
  else {
    WVar2 = WireFormatLite::GetTagWireType((uint32_t)reflection_local);
    local_61 = 0;
    if (WVar2 != WIRETYPE_LENGTH_DELIMITED) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x2fc,
                 "WireFormatLite::GetTagWireType(tag) == WireFormatLite::WIRETYPE_LENGTH_DELIMITED")
      ;
      local_61 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
    }
    if ((local_61 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    ctx_local = (ParseContext *)
                ParseContext::ParseMessage((ParseContext *)tag_local,local_48,(char *)ctx_local);
    if ((ctx_local != (ParseContext *)0x0) &&
       (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)sub_message), bVar1)) {
      this_01 = FieldDescriptor::message_type((FieldDescriptor *)sub_message);
      enum_type = (EnumDescriptor *)Descriptor::map_value(this_01);
      local_88 = FieldDescriptor::enum_type((FieldDescriptor *)enum_type);
      if ((local_88 != (EnumDescriptor *)0x0) &&
         (bVar1 = cpp::HasPreservingUnknownEnumSemantics((FieldDescriptor *)enum_type),
         this = local_88, !bVar1)) {
        this_02 = Message::GetReflection((Message *)local_48);
        iVar3 = Reflection::GetEnumValue(this_02,(Message *)local_48,(FieldDescriptor *)enum_type);
        pEVar6 = EnumDescriptor::FindValueByNumber(this,iVar3);
        if (pEVar6 == (EnumValueDescriptor *)0x0) {
          this_03 = Reflection::MutableUnknownFields((Reflection *)field_local,(Message *)ptr_local)
          ;
          iVar3 = FieldDescriptor::number((FieldDescriptor *)sub_message);
          MessageLite::SerializeAsString_abi_cxx11_(&local_a8,local_48);
          UnknownFieldSet::AddLengthDelimited<>(this_03,iVar3,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          Reflection::RemoveLast
                    ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)sub_message);
        }
      }
    }
    msg_local = (Message *)ctx_local;
  }
  return (char *)msg_local;
}

Assistant:

static const char* HandleMessage(Message* msg, const char* ptr,
                                 internal::ParseContext* ctx, uint64_t tag,
                                 const Reflection* reflection,
                                 const FieldDescriptor* field) {
  Message* sub_message;
  if (field->is_repeated()) {
    sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
  } else {
    sub_message = reflection->MutableMessage(msg, field, ctx->data().factory);
  }

  if (WireFormatLite::GetTagWireType(tag) ==
      WireFormatLite::WIRETYPE_START_GROUP) {
    return ctx->ParseGroup(sub_message, ptr, tag);
  } else {
    ABSL_DCHECK(WireFormatLite::GetTagWireType(tag) ==
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  }

  ptr = ctx->ParseMessage(sub_message, ptr);

  // For map entries, if the value is an unknown enum we have to push it
  // into the unknown field set and remove it from the list.
  if (ptr != nullptr && field->is_map()) {
    auto* value_field = field->message_type()->map_value();
    auto* enum_type = value_field->enum_type();
    if (enum_type != nullptr &&
        !internal::cpp::HasPreservingUnknownEnumSemantics(value_field) &&
        enum_type->FindValueByNumber(sub_message->GetReflection()->GetEnumValue(
            *sub_message, value_field)) == nullptr) {
      reflection->MutableUnknownFields(msg)->AddLengthDelimited(
          field->number(), sub_message->SerializeAsString());
      reflection->RemoveLast(msg, field);
    }
  }
  return ptr;
}